

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_integer_attribute_decoder.cc
# Opt level: O3

void __thiscall
draco::SequentialIntegerAttributeDecoder::StoreTypedValues<unsigned_char>
          (SequentialIntegerAttributeDecoder *this,uint32_t num_values)

{
  PointAttribute *pPVar1;
  void *__src;
  ulong uVar2;
  uint32_t uVar3;
  long lVar4;
  int iVar5;
  ulong __n;
  long local_38;
  
  __n = (ulong)(((this->super_SequentialAttributeDecoder).attribute_)->super_GeometryAttribute).
               num_components_;
  __src = operator_new__(__n);
  pPVar1 = (this->super_SequentialAttributeDecoder).portable_attribute_._M_t.
           super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
           ._M_t.
           super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
           .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl;
  if (pPVar1->num_unique_entries_ == 0) {
    local_38 = 0;
  }
  else {
    local_38 = *(long *)(pPVar1->super_GeometryAttribute).buffer_ +
               (pPVar1->super_GeometryAttribute).byte_offset_;
  }
  if (num_values != 0) {
    lVar4 = 0;
    iVar5 = 0;
    uVar3 = 0;
    do {
      if (__n != 0) {
        uVar2 = 0;
        do {
          *(undefined1 *)((long)__src + uVar2) =
               *(undefined1 *)(local_38 + (long)iVar5 * 4 + uVar2 * 4);
          uVar2 = uVar2 + 1;
        } while (__n != uVar2);
        iVar5 = iVar5 + (int)uVar2;
      }
      memcpy((void *)(*(long *)&(((((this->super_SequentialAttributeDecoder).attribute_)->
                                  attribute_buffer_)._M_t.
                                  super___uniq_ptr_impl<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_draco::DataBuffer_*,_std::default_delete<draco::DataBuffer>_>
                                  .super__Head_base<0UL,_draco::DataBuffer_*,_false>._M_head_impl)->
                                data_).
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_> +
                     lVar4),__src,__n);
      lVar4 = lVar4 + __n;
      uVar3 = uVar3 + 1;
    } while (uVar3 != num_values);
  }
  operator_delete__(__src);
  return;
}

Assistant:

void SequentialIntegerAttributeDecoder::StoreTypedValues(uint32_t num_values) {
  const int num_components = attribute()->num_components();
  const int entry_size = sizeof(AttributeTypeT) * num_components;
  const std::unique_ptr<AttributeTypeT[]> att_val(
      new AttributeTypeT[num_components]);
  const int32_t *const portable_attribute_data = GetPortableAttributeData();
  int val_id = 0;
  int out_byte_pos = 0;
  for (uint32_t i = 0; i < num_values; ++i) {
    for (int c = 0; c < num_components; ++c) {
      const AttributeTypeT value =
          static_cast<AttributeTypeT>(portable_attribute_data[val_id++]);
      att_val[c] = value;
    }
    // Store the integer value into the attribute buffer.
    attribute()->buffer()->Write(out_byte_pos, att_val.get(), entry_size);
    out_byte_pos += entry_size;
  }
}